

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemomesh.cc
# Opt level: O0

void lecturedemo::PrintGeometryInfo(Mesh *mesh,dim_t codim)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  reference ppEVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  ColXpr local_ab0;
  TransposeReturnType local_a78;
  uint local_a40;
  RefEl local_a3a;
  allocator<char> local_a39;
  int l;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  stringstream local_958 [8];
  stringstream ss_3;
  ostream local_948 [383];
  allocator<char> local_7c9;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  stringstream local_6e8 [8];
  stringstream ss_2;
  ostream local_6d8 [376];
  undefined1 local_560 [8];
  MatrixXd corners;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  stringstream local_460 [8];
  stringstream ss_1;
  ostream local_450 [376];
  Geometry *local_2d8;
  Geometry *geo_ptr;
  Entity *pEStack_2c8;
  size_type num_nodes;
  Entity *ent;
  iterator __end1;
  iterator __begin1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range1;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  uint local_14;
  Mesh *pMStack_10;
  dim_t codim_local;
  Mesh *mesh_local;
  
  local_14 = codim;
  pMStack_10 = mesh;
  uVar2 = (**mesh->_vptr_Mesh)();
  if (uVar2 < codim) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = std::operator<<(local_190,"codim ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    std::operator<<(poVar4," too large");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"(codim <= mesh.DimMesh())",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x5d,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"",(allocator<char> *)((long)&__range1 + 7));
    lf::base::AssertionFailed(&local_240,&local_268,0x5d,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  iVar3 = (*pMStack_10->_vptr_Mesh[2])(pMStack_10,(ulong)local_14);
  __begin1._M_current = (Entity **)CONCAT44(extraout_var,iVar3);
  __end1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  ent = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end1,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&ent);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    ppEVar5 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end1);
    pEStack_2c8 = *ppEVar5;
    iVar3 = (*pEStack_2c8->_vptr_Entity[4])();
    geo_ptr._3_1_ = (undefined1)iVar3;
    geo_ptr._4_4_ = lf::base::RefEl::NumNodes((RefEl *)((long)&geo_ptr + 3));
    iVar3 = (*pEStack_2c8->_vptr_Entity[3])();
    local_2d8 = (Geometry *)CONCAT44(extraout_var_00,iVar3);
    if (local_2d8 == (Geometry *)0x0) {
      std::__cxx11::stringstream::stringstream(local_460);
      std::operator<<(local_450,"Missing geometry!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"geo_ptr != nullptr",&local_481);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                 ,&local_4a9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_480,&local_4a8,100,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"false",&local_4f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                 ,&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"",
                 (allocator<char> *)
                 ((long)&corners.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols + 7));
      lf::base::AssertionFailed(&local_4f0,&local_518,100,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&corners.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols + 7));
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator(&local_4f1);
      abort();
    }
    lf::geometry::Corners((MatrixXd *)local_560,local_2d8);
    uVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_560);
    uVar2 = (*local_2d8->_vptr_Geometry[1])();
    if (uVar6 != uVar2) {
      std::__cxx11::stringstream::stringstream(local_6e8);
      std::operator<<(local_6d8,"dimension mismatch for coordinate vectors");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_708,"corners.rows() == geo_ptr->DimGlobal()",&local_709);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_730,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                 ,&local_731);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_708,&local_730,0x68,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"false",&local_779);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
                 ,&local_7a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"",&local_7c9);
      lf::base::AssertionFailed(&local_778,&local_7a0,0x68,&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator(&local_7c9);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator(&local_779);
      abort();
    }
    uVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_560);
    if (uVar6 != geo_ptr._4_4_) break;
    iVar3 = (*pEStack_2c8->_vptr_Entity[4])();
    local_a3a.type_ = (RefElType)iVar3;
    poVar4 = lf::base::operator<<((ostream *)&std::cout,&local_a3a);
    poVar4 = std::operator<<(poVar4,"(");
    uVar2 = (*pMStack_10->_vptr_Mesh[5])(pMStack_10,pEStack_2c8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::operator<<(poVar4,") pts: ");
    for (local_a40 = 0; local_a40 < geo_ptr._4_4_; local_a40 = local_a40 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_a40);
      poVar4 = std::operator<<(poVar4," =[");
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_ab0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_560,
                 (long)(int)local_a40);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose(&local_a78,
                (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                &local_ab0);
      poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                         *)&local_a78);
      std::operator<<(poVar4,"], ");
    }
    std::operator<<((ostream *)&std::cout,'\n');
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_560);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::stringstream(local_958);
  std::operator<<(local_948,"#corners mismath");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"corners.cols() == num_nodes",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
             ,&local_9a1);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_978,&local_9a0,0x69,&local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"false",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
             ,&local_a11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&l,"",&local_a39);
  lf::base::AssertionFailed(&local_9e8,&local_a10,0x69,(string *)&l);
  std::__cxx11::string::~string((string *)&l);
  std::allocator<char>::~allocator(&local_a39);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  abort();
}

Assistant:

void PrintGeometryInfo(const lf::mesh::Mesh &mesh, dim_t codim) {
  LF_ASSERT_MSG((codim <= mesh.DimMesh()),
		"codim " << +codim << " too large");
  // loop over all entities of the specified codimension
  for (const lf::mesh::Entity* ent : mesh.Entities(codim)) {
    // Number of nodes = number of corner points
    const size_type num_nodes = ent->RefEl().NumNodes();
    // Obtain pointer to geometry object associated with entity
    const lf::geometry::Geometry *geo_ptr = ent->Geometry();
    LF_ASSERT_MSG(geo_ptr != nullptr, "Missing geometry!");
    // Fetch coordinates of corner points in packed format \cref{par:coords}
    Eigen::MatrixXd corners = lf::geometry::Corners(*geo_ptr);
    LF_ASSERT_MSG(corners.rows() == geo_ptr->DimGlobal(),
                  "dimension mismatch for coordinate vectors");
    LF_ASSERT_MSG(corners.cols() == num_nodes, "#corners mismath");
    std::cout << ent->RefEl() << "(" << mesh.Index(*ent) << ") pts: ";
    for (int l = 0; l < num_nodes; ++l) {
      std::cout << l << " =[" << corners.col(l).transpose() << "], ";
    }
    std::cout << '\n';
  }}